

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O0

void L3_midside_stereo(float *left,int n)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  undefined8 *puVar9;
  int in_ESI;
  long in_RDI;
  float b;
  float a;
  f4 vr;
  f4 vl;
  float *right;
  int i;
  int local_a8;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  local_a8 = 0;
  lVar8 = in_RDI + 0x900;
  iVar7 = have_simd();
  if (iVar7 != 0) {
    for (; local_a8 < in_ESI + -3; local_a8 = local_a8 + 4) {
      puVar9 = (undefined8 *)(in_RDI + (long)local_a8 * 4);
      uVar3 = *puVar9;
      uVar4 = puVar9[1];
      puVar9 = (undefined8 *)(lVar8 + (long)local_a8 * 4);
      uVar5 = *puVar9;
      uVar6 = puVar9[1];
      puVar9 = (undefined8 *)(in_RDI + (long)local_a8 * 4);
      local_38 = (float)uVar3;
      fStack_34 = (float)((ulong)uVar3 >> 0x20);
      fStack_30 = (float)uVar4;
      fStack_2c = (float)((ulong)uVar4 >> 0x20);
      local_48 = (float)uVar5;
      fStack_44 = (float)((ulong)uVar5 >> 0x20);
      fStack_40 = (float)uVar6;
      fStack_3c = (float)((ulong)uVar6 >> 0x20);
      *puVar9 = CONCAT44(fStack_34 + fStack_44,local_38 + local_48);
      puVar9[1] = CONCAT44(fStack_2c + fStack_3c,fStack_30 + fStack_40);
      puVar9 = (undefined8 *)(lVar8 + (long)local_a8 * 4);
      *puVar9 = CONCAT44(fStack_34 - fStack_44,local_38 - local_48);
      puVar9[1] = CONCAT44(fStack_2c - fStack_3c,fStack_30 - fStack_40);
    }
  }
  for (; local_a8 < in_ESI; local_a8 = local_a8 + 1) {
    fVar1 = *(float *)(in_RDI + (long)local_a8 * 4);
    fVar2 = *(float *)(lVar8 + (long)local_a8 * 4);
    *(float *)(in_RDI + (long)local_a8 * 4) = fVar1 + fVar2;
    *(float *)(lVar8 + (long)local_a8 * 4) = fVar1 - fVar2;
  }
  return;
}

Assistant:

static void L3_midside_stereo(float *left, int n)
{
    int i = 0;
    float *right = left + 576;
#if HAVE_SIMD
    if (have_simd()) for (; i < n - 3; i += 4)
    {
        f4 vl = VLD(left + i);
        f4 vr = VLD(right + i);
        VSTORE(left + i, VADD(vl, vr));
        VSTORE(right + i, VSUB(vl, vr));
    }
#endif /* HAVE_SIMD */
    for (; i < n; i++)
    {
        float a = left[i];
        float b = right[i];
        left[i] = a + b;
        right[i] = a - b;
    }
}